

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# telnet.c
# Opt level: O2

CURLcode telnet_do(connectdata *conn,_Bool *done)

{
  byte *pbVar1;
  undefined4 *puVar2;
  byte bVar3;
  curl_socket_t sockfd;
  Curl_easy *data;
  Curl_easy *pCVar4;
  int *piVar5;
  undefined4 *puVar6;
  void *pvVar7;
  ssize_t sVar8;
  int iVar9;
  int iVar10;
  CURLcode CVar11;
  CURLcode CVar12;
  uint uVar13;
  void *pvVar14;
  curl_slist *pcVar15;
  curl_slist *pcVar16;
  size_t sVar17;
  byte *pbVar18;
  long lVar19;
  ulong uVar20;
  char *pcVar21;
  uint nfds;
  uint uVar22;
  ulong uVar23;
  ulong uVar24;
  curl_slist **ppcVar25;
  bool bVar26;
  timeval newer;
  undefined8 *local_1e8;
  long local_1e0;
  int local_1d8;
  long local_1c8;
  ssize_t nread;
  undefined8 uStack_1b0;
  undefined8 local_1a8;
  undefined8 uStack_1a0;
  undefined8 local_198;
  undefined8 uStack_190;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 local_158;
  undefined8 uStack_150;
  undefined8 local_148;
  undefined8 uStack_140;
  pollfd pfd [2];
  
  data = conn->data;
  sockfd = conn->sock[0];
  *done = true;
  pvVar14 = (*Curl_ccalloc)(1,0x1ed0);
  if (pvVar14 == (void *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  pCVar4 = conn->data;
  (pCVar4->req).protop = pvVar14;
  *(undefined4 *)((long)pvVar14 + 0x1ec8) = 0;
  *(long *)((long)pvVar14 + 0x1eb8) = (long)pvVar14 + 0x1cb8;
  *(undefined4 *)((long)pvVar14 + 0x814) = 1;
  *(undefined4 *)((long)pvVar14 + 0x1414) = 1;
  *(undefined4 *)((long)pvVar14 + 0x808) = 1;
  *(undefined8 *)((long)pvVar14 + 0x1408) = 0x100000001;
  *(undefined4 *)((long)pvVar14 + 0x1884) = 1;
  piVar5 = (int *)(data->req).protop;
  local_148 = 0;
  uStack_140 = 0;
  local_158 = 0;
  uStack_150 = 0;
  local_168 = 0;
  uStack_160 = 0;
  local_178 = 0;
  uStack_170 = 0;
  local_188 = 0;
  uStack_180 = 0;
  local_198 = 0;
  uStack_190 = 0;
  local_1a8 = 0;
  uStack_1a0 = 0;
  nread = 0;
  uStack_1b0 = 0;
  memset(pfd,0,0x100);
  if ((conn->bits).user_passwd == true) {
    curl_msnprintf((char *)pfd,0x100,"USER,%s");
    pcVar15 = curl_slist_append(*(curl_slist **)((long)pvVar14 + 0x1cb0),(char *)pfd);
    if (pcVar15 == (curl_slist *)0x0) {
      CVar11 = CURLE_OUT_OF_MEMORY;
LAB_001292ce:
      local_1e8 = (undefined8 *)((long)pvVar14 + 0x1cb0);
      curl_slist_free_all((curl_slist *)*local_1e8);
      *local_1e8 = 0;
      return CVar11;
    }
    *(curl_slist **)((long)pvVar14 + 0x1cb0) = pcVar15;
    *(undefined4 *)((long)pvVar14 + 0x8a4) = 1;
  }
  pcVar21 = (data->state).buffer;
  ppcVar25 = &(pCVar4->set).telnet_options;
  while (pcVar15 = *ppcVar25, pcVar15 != (curl_slist *)0x0) {
    iVar9 = __isoc99_sscanf(pcVar15->data,"%127[^= ]%*[ =]%255s",&nread);
    if (iVar9 != 2) {
LAB_001292a2:
      CVar11 = CURLE_TELNET_OPTION_SYNTAX;
      pcVar21 = "Syntax error in telnet option: %s";
LAB_001292ad:
      Curl_failf(pCVar4,pcVar21,pcVar15->data);
      goto LAB_001292ce;
    }
    iVar9 = Curl_raw_equal((char *)&nread,"TTYPE");
    if (iVar9 == 0) {
      iVar9 = Curl_raw_equal((char *)&nread,"XDISPLOC");
      if (iVar9 == 0) {
        iVar9 = Curl_raw_equal((char *)&nread,"NEW_ENV");
        if (iVar9 == 0) {
          iVar9 = Curl_raw_equal((char *)&nread,"WS");
          if (iVar9 == 0) {
            iVar9 = Curl_raw_equal((char *)&nread,"BINARY");
            if (iVar9 == 0) {
              pcVar21 = "Unknown telnet option %s";
              CVar11 = CURLE_UNKNOWN_OPTION;
              goto LAB_001292ad;
            }
            iVar9 = atoi((char *)pfd);
            if (iVar9 != 1) {
              *(undefined4 *)((long)pvVar14 + 0x808) = 0;
              *(undefined4 *)((long)pvVar14 + 0x1408) = 0;
            }
          }
          else {
            iVar9 = __isoc99_sscanf(pfd,"%hu%*[xX]%hu",(long)pvVar14 + 0x1ca8);
            if (iVar9 != 2) goto LAB_001292a2;
            *(undefined4 *)((long)pvVar14 + 0x884) = 1;
          }
        }
        else {
          pcVar16 = curl_slist_append(*(curl_slist **)((long)pvVar14 + 0x1cb0),(char *)pfd);
          if (pcVar16 == (curl_slist *)0x0) {
            CVar11 = CURLE_OUT_OF_MEMORY;
            goto LAB_001292ce;
          }
          *(curl_slist **)((long)pvVar14 + 0x1cb0) = pcVar16;
          *(undefined4 *)((long)pvVar14 + 0x8a4) = 1;
        }
      }
      else {
        strncpy((char *)((long)pvVar14 + 0x1c28),(char *)pfd,0x7f);
        *(undefined1 *)((long)pvVar14 + 0x1ca7) = 0;
        *(undefined4 *)((long)pvVar14 + 0x894) = 1;
      }
    }
    else {
      strncpy((char *)((long)pvVar14 + 0x1c08),(char *)pfd,0x1f);
      *(undefined1 *)((long)pvVar14 + 0x1c27) = 0;
      *(undefined4 *)((long)pvVar14 + 0x868) = 1;
    }
    ppcVar25 = &pcVar15->next;
  }
  pfd[0].events = 1;
  iVar9 = (data->set).is_fread_set;
  pfd[0].fd = sockfd;
  if (iVar9 == 0) {
    pfd[1].fd = fileno((FILE *)(data->state).in);
    pfd[1].events = 1;
    local_1d8 = 1000;
    nfds = 2;
  }
  else {
    local_1d8 = 100;
    nfds = 1;
  }
  local_1e0 = 0;
  bVar26 = true;
  local_1c8 = 0;
  CVar11 = CURLE_OK;
LAB_00129329:
  if (bVar26) {
    iVar10 = Curl_poll(pfd,nfds,local_1d8);
    if (iVar10 == 0) {
      pfd[0].revents = 0;
      pfd[1].revents = 0;
      goto LAB_001293a0;
    }
    if (iVar10 != -1) {
      if ((pfd[0].revents & 1U) == 0) goto LAB_001293a0;
      CVar11 = Curl_read(conn,sockfd,pcVar21,0x3fff,&nread);
      if (CVar11 != CURLE_OK) {
        bVar26 = true;
        if (CVar11 == CURLE_AGAIN) goto LAB_00129b2f;
        goto LAB_00129406;
      }
      if (nread < 1) {
        bVar26 = false;
        CVar11 = CURLE_OK;
      }
      else {
        local_1c8 = local_1c8 + nread;
        Curl_pgrsSetDownloadCounter(data,local_1c8);
        sVar8 = nread;
        pCVar4 = conn->data;
        puVar6 = (undefined4 *)(pCVar4->req).protop;
        pbVar1 = (byte *)(puVar6 + 0x7ae);
        puVar2 = puVar6 + 0x72e;
        uVar20 = 0;
        uVar23 = 0xffffffffffffffff;
        while( true ) {
          uVar22 = (uint)uVar23;
          if (sVar8 == uVar20) break;
          uVar13 = uVar22;
          if (8 < (uint)puVar6[0x7b2]) goto LAB_00129b0b;
          bVar3 = pcVar21[uVar20];
          uVar24 = (ulong)bVar3;
          switch(puVar6[0x7b2]) {
          case 0:
            if (bVar3 == 0xd) {
              puVar6[0x7b2] = 6;
            }
            else if (bVar3 == 0xff) {
              puVar6[0x7b2] = 1;
              goto LAB_001296eb;
            }
LAB_001299ec:
            uVar24 = uVar20;
            if (-1 < (int)uVar22) {
              uVar24 = uVar23;
            }
            uVar13 = (uint)uVar24;
            break;
          case 1:
switchD_001294ee_caseD_1:
            switch(bVar3) {
            case 0xfa:
              *(undefined4 **)(puVar6 + 0x7ae) = puVar2;
LAB_00129860:
              puVar6[0x7b2] = 7;
              break;
            case 0xfb:
              puVar6[0x7b2] = 2;
              break;
            case 0xfc:
              puVar6[0x7b2] = 3;
              break;
            case 0xfd:
              puVar6[0x7b2] = 4;
              break;
            case 0xfe:
              puVar6[0x7b2] = 5;
              break;
            case 0xff:
              puVar6[0x7b2] = 0;
              goto LAB_001299ec;
            default:
              puVar6[0x7b2] = 0;
              printoption(pCVar4,"RCVD",0xff,(uint)bVar3);
            }
            break;
          case 2:
            printoption(pCVar4,"RCVD",0xfb,(uint)bVar3);
            *puVar6 = 1;
            pvVar14 = (conn->data->req).protop;
            iVar10 = *(int *)((long)pvVar14 + uVar24 * 4 + 0xc08);
            if (iVar10 == 3) {
              iVar10 = *(int *)((long)pvVar14 + uVar24 * 4 + 0x1008);
              if (iVar10 != 1) goto LAB_00129949;
              *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0xc08) = 1;
LAB_0012992a:
              *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0x1008) = 0;
            }
            else if (iVar10 == 2) {
              iVar10 = *(int *)((long)pvVar14 + uVar24 * 4 + 0x1008);
              if (iVar10 == 1) {
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0xc08) = 3;
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0x1008) = 0;
                goto LAB_00129ab5;
              }
              if (iVar10 == 0) {
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0xc08) = 1;
              }
            }
            else if (iVar10 == 0) {
              if (*(int *)((long)pvVar14 + uVar24 * 4 + 0x1408) == 1) {
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0xc08) = 1;
                goto LAB_00129ad4;
              }
LAB_00129ab5:
              iVar10 = 0xfe;
              goto LAB_00129af8;
            }
            goto LAB_00129b00;
          case 3:
            printoption(pCVar4,"RCVD",0xfc,(uint)bVar3);
            *puVar6 = 1;
            pvVar14 = (conn->data->req).protop;
            iVar10 = *(int *)((long)pvVar14 + uVar24 * 4 + 0xc08);
            if (iVar10 == 3) {
              iVar10 = *(int *)((long)pvVar14 + uVar24 * 4 + 0x1008);
              if (iVar10 == 1) {
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0xc08) = 2;
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0x1008) = 0;
LAB_00129ad4:
                iVar10 = 0xfd;
                goto LAB_00129af8;
              }
            }
            else {
              if (iVar10 != 2) {
                if (iVar10 == 1) {
                  *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0xc08) = 0;
                  goto LAB_00129ab5;
                }
                goto LAB_00129b00;
              }
              iVar10 = *(int *)((long)pvVar14 + uVar24 * 4 + 0x1008);
              if (iVar10 == 1) {
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0xc08) = 0;
                goto LAB_0012992a;
              }
            }
LAB_00129949:
            if (iVar10 == 0) {
              *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0xc08) = 0;
            }
            goto LAB_00129b00;
          case 4:
            printoption(pCVar4,"RCVD",0xfd,(uint)bVar3);
            *puVar6 = 1;
            pvVar14 = (conn->data->req).protop;
            iVar10 = *(int *)((long)pvVar14 + uVar24 * 4 + 8);
            if (iVar10 == 3) {
              iVar10 = *(int *)((long)pvVar14 + uVar24 * 4 + 0x408);
              if (iVar10 == 1) {
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 8) = 1;
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0x408) = 0;
              }
              else if (iVar10 == 0) {
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 8) = 0;
              }
            }
            else if (iVar10 == 2) {
              iVar10 = *(int *)((long)pvVar14 + uVar24 * 4 + 0x408);
              if (iVar10 == 1) {
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 8) = 3;
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0x1008) = 0;
LAB_00129a68:
                send_negotiation(conn,0xfc,(uint)bVar3);
              }
              else if (iVar10 == 0) {
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 8) = 1;
                goto LAB_00129892;
              }
            }
            else if (iVar10 == 0) {
              if (*(int *)((long)pvVar14 + uVar24 * 4 + 0x808) == 1) {
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 8) = 1;
                send_negotiation(conn,0xfb,(uint)bVar3);
LAB_00129892:
                if (*(int *)((long)pvVar14 + uVar24 * 4 + 0x1808) != 1) goto LAB_00129a8e;
              }
              else {
                if (*(int *)((long)pvVar14 + uVar24 * 4 + 0x1808) != 1) goto LAB_00129a68;
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 8) = 1;
                send_negotiation(conn,0xfb,(uint)bVar3);
              }
              sendsuboption(conn,(uint)bVar3);
            }
LAB_00129a8e:
            puVar6[0x7b2] = 0;
            break;
          case 5:
            printoption(pCVar4,"RCVD",0xfe,(uint)bVar3);
            *puVar6 = 1;
            pvVar14 = (conn->data->req).protop;
            iVar10 = *(int *)((long)pvVar14 + uVar24 * 4 + 8);
            if (iVar10 == 3) {
              iVar10 = *(int *)((long)pvVar14 + uVar24 * 4 + 0x408);
              if (iVar10 == 1) {
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 8) = 2;
                *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0x408) = 0;
                iVar10 = 0xfb;
LAB_00129af8:
                send_negotiation(conn,iVar10,(uint)bVar3);
              }
              else {
LAB_00129991:
                if (iVar10 == 0) {
                  *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 8) = 0;
                }
              }
            }
            else if (iVar10 == 2) {
              iVar10 = *(int *)((long)pvVar14 + uVar24 * 4 + 0x408);
              if (iVar10 != 1) goto LAB_00129991;
              *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 8) = 0;
              *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 0x408) = 0;
            }
            else if (iVar10 == 1) {
              *(undefined4 *)((long)pvVar14 + uVar24 * 4 + 8) = 0;
              iVar10 = 0xfc;
              goto LAB_00129af8;
            }
            goto LAB_00129b00;
          case 6:
            puVar6[0x7b2] = 0;
            if (bVar3 != 0) goto LAB_001299ec;
LAB_001296eb:
            uVar13 = 0xffffffff;
            if (-1 < (int)uVar22) {
              CVar11 = Curl_client_write(conn,1,pcVar21 + (uVar23 & 0xffffffff),
                                         (long)(int)((int)uVar20 - uVar22));
              uVar13 = 0xffffffff;
              if (CVar11 != CURLE_OK) goto LAB_00129bb1;
            }
            break;
          case 7:
            if (bVar3 == 0xff) {
              puVar6[0x7b2] = 8;
            }
            else {
              pbVar18 = *(byte **)pbVar1;
              if (pbVar18 < pbVar1) {
                *(byte **)pbVar1 = pbVar18 + 1;
                *pbVar18 = bVar3;
              }
            }
            break;
          case 8:
            pbVar18 = *(byte **)pbVar1;
            if (bVar3 != 0xf0) {
              if (bVar3 != 0xff) {
                if (pbVar18 < pbVar1) {
                  *(byte **)pbVar1 = pbVar18 + 1;
                  *pbVar18 = 0xff;
                  pbVar18 = *(byte **)pbVar1;
                }
                if (pbVar18 < pbVar1) {
                  *(byte **)pbVar1 = pbVar18 + 1;
                  *pbVar18 = bVar3;
                  pbVar18 = *(byte **)pbVar1;
                }
                *(byte **)(puVar6 + 0x7b0) = pbVar18 + -2;
                *(undefined4 **)(puVar6 + 0x7ae) = puVar2;
                printoption(pCVar4,"In SUBOPTION processing, RCVD",0xff,(uint)bVar3);
                suboption(conn);
                puVar6[0x7b2] = 1;
                goto switchD_001294ee_caseD_1;
              }
              if (pbVar18 < pbVar1) {
                *(byte **)pbVar1 = pbVar18 + 1;
                *pbVar18 = 0xff;
              }
              goto LAB_00129860;
            }
            if (pbVar18 < pbVar1) {
              *(byte **)pbVar1 = pbVar18 + 1;
              *pbVar18 = 0xff;
              pbVar18 = *(byte **)pbVar1;
            }
            if (pbVar18 < pbVar1) {
              *(byte **)pbVar1 = pbVar18 + 1;
              *pbVar18 = 0xf0;
              pbVar18 = *(byte **)pbVar1;
            }
            *(byte **)(puVar6 + 0x7b0) = pbVar18 + -2;
            *(undefined4 **)(puVar6 + 0x7ae) = puVar2;
            suboption(conn);
LAB_00129b00:
            puVar6[0x7b2] = 0;
          }
LAB_00129b0b:
          uVar20 = uVar20 + 1;
          uVar23 = (ulong)uVar13;
        }
        if (((int)uVar22 < 0) ||
           (CVar11 = Curl_client_write(conn,1,pcVar21 + (uVar23 & 0xffffffff),
                                       (long)(int)((int)sVar8 - uVar22)), CVar11 == CURLE_OK)) {
          CVar11 = CURLE_OK;
          if ((*piVar5 != 0) && (piVar5[1] == 0)) {
            pvVar14 = (conn->data->req).protop;
            lVar19 = 0;
            do {
              if (lVar19 != 1) {
                if (lVar19 == 0x28) goto LAB_00129d18;
                if (*(int *)((long)pvVar14 + lVar19 * 4 + 0x808) == 1) {
                  pvVar7 = (conn->data->req).protop;
                  iVar10 = *(int *)((long)pvVar7 + lVar19 * 4 + 8);
                  if (iVar10 == 3) {
                    if (*(int *)((long)pvVar7 + lVar19 * 4 + 0x408) == 0) {
                      *(undefined4 *)((long)pvVar7 + lVar19 * 4 + 0x408) = 1;
                    }
                  }
                  else if (iVar10 == 2) {
                    if (*(int *)((long)pvVar7 + lVar19 * 4 + 0x408) == 1) {
                      *(undefined4 *)((long)pvVar7 + lVar19 * 4 + 0x408) = 0;
                    }
                  }
                  else if (iVar10 == 0) {
                    *(undefined4 *)((long)pvVar7 + lVar19 * 4 + 8) = 2;
                    send_negotiation(conn,0xfb,(int)lVar19);
                  }
                }
                if (*(int *)((long)pvVar14 + lVar19 * 4 + 0x1408) == 1) {
                  pvVar7 = (conn->data->req).protop;
                  iVar10 = *(int *)((long)pvVar7 + lVar19 * 4 + 0xc08);
                  if (iVar10 == 3) {
                    if (*(int *)((long)pvVar7 + lVar19 * 4 + 0x1008) == 0) {
                      *(undefined4 *)((long)pvVar7 + lVar19 * 4 + 0x1008) = 1;
                    }
                  }
                  else if (iVar10 == 2) {
                    if (*(int *)((long)pvVar7 + lVar19 * 4 + 0x1008) == 1) {
                      *(undefined4 *)((long)pvVar7 + lVar19 * 4 + 0x1008) = 0;
                    }
                  }
                  else if (iVar10 == 0) {
                    *(undefined4 *)((long)pvVar7 + lVar19 * 4 + 0xc08) = 2;
                    send_negotiation(conn,0xfd,(int)lVar19);
                  }
                }
              }
              lVar19 = lVar19 + 1;
            } while( true );
          }
          goto LAB_001293a0;
        }
LAB_00129bb1:
        bVar26 = false;
      }
      goto LAB_00129b2f;
    }
  }
  goto LAB_00129d32;
LAB_00129d18:
  piVar5[1] = 1;
LAB_001293a0:
  nread = 0;
  if (iVar9 == 0) {
    if ((pfd[1].revents & 1U) != 0) {
      nread = read(pfd[1].fd,pcVar21,0x3fff);
LAB_0012942b:
      if (0 < nread) {
        CVar12 = send_telnet_data(conn,pcVar21,nread);
        CVar11 = CURLE_OK;
        if (CVar12 != CURLE_OK) {
          bVar26 = false;
          CVar11 = CVar12;
          goto LAB_00129b2f;
        }
        local_1e0 = local_1e0 + nread;
        Curl_pgrsSetUploadCounter(data,local_1e0);
        goto LAB_00129b2d;
      }
    }
    bVar26 = nread == 0;
  }
  else {
    sVar17 = (*(data->state).fread_func)(pcVar21,1,0x3fff,(data->state).in);
    nread = (ssize_t)(int)sVar17;
    if (sVar17 << 0x20 == 0x1000000000000000) {
LAB_00129406:
      bVar26 = false;
      goto LAB_00129b2f;
    }
    if (sVar17 << 0x20 != 0x1000000100000000) goto LAB_0012942b;
LAB_00129b2d:
    bVar26 = true;
  }
LAB_00129b2f:
  if ((data->set).timeout != 0) {
    newer = curlx_tvnow();
    lVar19 = curlx_tvdiff(newer,conn->created);
    if ((data->set).timeout <= lVar19) {
      bVar26 = false;
      Curl_failf(data,"Time-out");
      CVar11 = CURLE_OPERATION_TIMEDOUT;
    }
  }
  iVar10 = Curl_pgrsUpdate(conn);
  if (iVar10 != 0) {
    CVar11 = CURLE_ABORTED_BY_CALLBACK;
LAB_00129d32:
    Curl_setup_transfer(conn,-1,-1,false,(curl_off_t *)0x0,-1,(curl_off_t *)0x0);
    return CVar11;
  }
  goto LAB_00129329;
}

Assistant:

static CURLcode telnet_do(struct connectdata *conn, bool *done)
{
  CURLcode result;
  struct Curl_easy *data = conn->data;
  curl_socket_t sockfd = conn->sock[FIRSTSOCKET];
#ifdef USE_WINSOCK
  HMODULE wsock2;
  WSOCK2_FUNC close_event_func;
  WSOCK2_FUNC create_event_func;
  WSOCK2_FUNC event_select_func;
  WSOCK2_FUNC enum_netevents_func;
  WSAEVENT event_handle;
  WSANETWORKEVENTS events;
  HANDLE stdin_handle;
  HANDLE objs[2];
  DWORD  obj_count;
  DWORD  wait_timeout;
  DWORD waitret;
  DWORD readfile_read;
  int err;
#else
  int interval_ms;
  struct pollfd pfd[2];
  int poll_cnt;
  curl_off_t total_dl = 0;
  curl_off_t total_ul = 0;
#endif
  ssize_t nread;
  struct timeval now;
  bool keepon = TRUE;
  char *buf = data->state.buffer;
  struct TELNET *tn;

  *done = TRUE; /* unconditionally */

  result = init_telnet(conn);
  if(result)
    return result;

  tn = (struct TELNET *)data->req.protop;

  result = check_telnet_options(conn);
  if(result)
    return result;

#ifdef USE_WINSOCK
  /*
  ** This functionality only works with WinSock >= 2.0.  So,
  ** make sure have it.
  */
  result = check_wsock2(data);
  if(result)
    return result;

  /* OK, so we have WinSock 2.0.  We need to dynamically */
  /* load ws2_32.dll and get the function pointers we need. */
  wsock2 = Curl_load_library(TEXT("WS2_32.DLL"));
  if(wsock2 == NULL) {
    failf(data, "failed to load WS2_32.DLL (%d)", ERRNO);
    return CURLE_FAILED_INIT;
  }

  /* Grab a pointer to WSACreateEvent */
  create_event_func = GetProcAddress(wsock2, "WSACreateEvent");
  if(create_event_func == NULL) {
    failf(data, "failed to find WSACreateEvent function (%d)", ERRNO);
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSACloseEvent */
  close_event_func = GetProcAddress(wsock2, "WSACloseEvent");
  if(close_event_func == NULL) {
    failf(data, "failed to find WSACloseEvent function (%d)", ERRNO);
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSAEventSelect */
  event_select_func = GetProcAddress(wsock2, "WSAEventSelect");
  if(event_select_func == NULL) {
    failf(data, "failed to find WSAEventSelect function (%d)", ERRNO);
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* And WSAEnumNetworkEvents */
  enum_netevents_func = GetProcAddress(wsock2, "WSAEnumNetworkEvents");
  if(enum_netevents_func == NULL) {
    failf(data, "failed to find WSAEnumNetworkEvents function (%d)", ERRNO);
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* We want to wait for both stdin and the socket. Since
  ** the select() function in winsock only works on sockets
  ** we have to use the WaitForMultipleObjects() call.
  */

  /* First, create a sockets event object */
  event_handle = (WSAEVENT)create_event_func();
  if(event_handle == WSA_INVALID_EVENT) {
    failf(data, "WSACreateEvent failed (%d)", SOCKERRNO);
    FreeLibrary(wsock2);
    return CURLE_FAILED_INIT;
  }

  /* Tell winsock what events we want to listen to */
  if(event_select_func(sockfd, event_handle, FD_READ|FD_CLOSE) ==
     SOCKET_ERROR) {
    close_event_func(event_handle);
    FreeLibrary(wsock2);
    return CURLE_OK;
  }

  /* The get the Windows file handle for stdin */
  stdin_handle = GetStdHandle(STD_INPUT_HANDLE);

  /* Create the list of objects to wait for */
  objs[0] = event_handle;
  objs[1] = stdin_handle;

  /* If stdin_handle is a pipe, use PeekNamedPipe() method to check it,
     else use the old WaitForMultipleObjects() way */
  if(GetFileType(stdin_handle) == FILE_TYPE_PIPE ||
     data->set.is_fread_set) {
    /* Don't wait for stdin_handle, just wait for event_handle */
    obj_count = 1;
    /* Check stdin_handle per 100 milliseconds */
    wait_timeout = 100;
  }
  else {
    obj_count = 2;
    wait_timeout = 1000;
  }

  /* Keep on listening and act on events */
  while(keepon) {
    waitret = WaitForMultipleObjects(obj_count, objs, FALSE, wait_timeout);
    switch(waitret) {
    case WAIT_TIMEOUT:
    {
      for(;;) {
        if(data->set.is_fread_set) {
          /* read from user-supplied method */
          result = (int)data->state.fread_func(buf, 1, BUFSIZE - 1,
                                               data->state.in);
          if(result == CURL_READFUNC_ABORT) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(result == CURL_READFUNC_PAUSE)
            break;

          if(result == 0)                        /* no bytes */
            break;

          readfile_read = result; /* fall thru with number of bytes read */
        }
        else {
          /* read from stdin */
          if(!PeekNamedPipe(stdin_handle, NULL, 0, NULL,
                            &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }

          if(!readfile_read)
            break;

          if(!ReadFile(stdin_handle, buf, sizeof(data->state.buffer),
                       &readfile_read, NULL)) {
            keepon = FALSE;
            result = CURLE_READ_ERROR;
            break;
          }
        }

        result = send_telnet_data(conn, buf, readfile_read);
        if(result) {
          keepon = FALSE;
          break;
        }
      }
    }
    break;

    case WAIT_OBJECT_0 + 1:
    {
      if(!ReadFile(stdin_handle, buf, sizeof(data->state.buffer),
                   &readfile_read, NULL)) {
        keepon = FALSE;
        result = CURLE_READ_ERROR;
        break;
      }

      result = send_telnet_data(conn, buf, readfile_read);
      if(result) {
        keepon = FALSE;
        break;
      }
    }
    break;

    case WAIT_OBJECT_0:

      events.lNetworkEvents = 0;
      if(SOCKET_ERROR == enum_netevents_func(sockfd, event_handle, &events)) {
        if((err = SOCKERRNO) != EINPROGRESS) {
          infof(data, "WSAEnumNetworkEvents failed (%d)", err);
          keepon = FALSE;
          result = CURLE_READ_ERROR;
        }
        break;
      }
      if(events.lNetworkEvents & FD_READ) {
        /* read data from network */
        result = Curl_read(conn, sockfd, buf, BUFSIZE - 1, &nread);
        /* read would've blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        else if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        result = telrcv(conn, (unsigned char *) buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise don't. We don't want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(conn);
          tn->already_negotiated = 1;
        }
      }
      if(events.lNetworkEvents & FD_CLOSE) {
        keepon = FALSE;
      }
      break;

    }

    if(data->set.timeout) {
      now = Curl_tvnow();
      if(Curl_tvdiff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }
  }

  /* We called WSACreateEvent, so call WSACloseEvent */
  if(!close_event_func(event_handle)) {
    infof(data, "WSACloseEvent failed (%d)", SOCKERRNO);
  }

  /* "Forget" pointers into the library we're about to free */
  create_event_func = NULL;
  close_event_func = NULL;
  event_select_func = NULL;
  enum_netevents_func = NULL;

  /* We called LoadLibrary, so call FreeLibrary */
  if(!FreeLibrary(wsock2))
    infof(data, "FreeLibrary(wsock2) failed (%d)", ERRNO);
#else
  pfd[0].fd = sockfd;
  pfd[0].events = POLLIN;

  if(data->set.is_fread_set) {
    poll_cnt = 1;
    interval_ms = 100; /* poll user-supplied read function */
  }
  else {
    /* really using fread, so infile is a FILE* */
    pfd[1].fd = fileno((FILE *)data->state.in);
    pfd[1].events = POLLIN;
    poll_cnt = 2;
    interval_ms = 1 * 1000;
  }

  while(keepon) {
    switch (Curl_poll(pfd, poll_cnt, interval_ms)) {
    case -1:                    /* error, stop reading */
      keepon = FALSE;
      continue;
    case 0:                     /* timeout */
      pfd[0].revents = 0;
      pfd[1].revents = 0;
      /* fall through */
    default:                    /* read! */
      if(pfd[0].revents & POLLIN) {
        /* read data from network */
        result = Curl_read(conn, sockfd, buf, BUFSIZE - 1, &nread);
        /* read would've blocked. Loop again */
        if(result == CURLE_AGAIN)
          break;
        /* returned not-zero, this an error */
        else if(result) {
          keepon = FALSE;
          break;
        }
        /* returned zero but actually received 0 or less here,
           the server closed the connection and we bail out */
        else if(nread <= 0) {
          keepon = FALSE;
          break;
        }

        total_dl += nread;
        Curl_pgrsSetDownloadCounter(data, total_dl);
        result = telrcv(conn, (unsigned char *)buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }

        /* Negotiate if the peer has started negotiating,
           otherwise don't. We don't want to speak telnet with
           non-telnet servers, like POP or SMTP. */
        if(tn->please_negotiate && !tn->already_negotiated) {
          negotiate(conn);
          tn->already_negotiated = 1;
        }
      }

      nread = 0;
      if(poll_cnt == 2) {
        if(pfd[1].revents & POLLIN) { /* read from in file */
          nread = read(pfd[1].fd, buf, BUFSIZE - 1);
        }
      }
      else {
        /* read from user-supplied method */
        nread = (int)data->state.fread_func(buf, 1, BUFSIZE - 1,
                                            data->state.in);
        if(nread == CURL_READFUNC_ABORT) {
          keepon = FALSE;
          break;
        }
        if(nread == CURL_READFUNC_PAUSE)
          break;
      }

      if(nread > 0) {
        result = send_telnet_data(conn, buf, nread);
        if(result) {
          keepon = FALSE;
          break;
        }
        total_ul += nread;
        Curl_pgrsSetUploadCounter(data, total_ul);
      }
      else if(nread < 0)
        keepon = FALSE;

      break;
    } /* poll switch statement */

    if(data->set.timeout) {
      now = Curl_tvnow();
      if(Curl_tvdiff(now, conn->created) >= data->set.timeout) {
        failf(data, "Time-out");
        result = CURLE_OPERATION_TIMEDOUT;
        keepon = FALSE;
      }
    }

    if(Curl_pgrsUpdate(conn)) {
      result = CURLE_ABORTED_BY_CALLBACK;
      break;
    }
  }
#endif
  /* mark this as "no further transfer wanted" */
  Curl_setup_transfer(conn, -1, -1, FALSE, NULL, -1, NULL);

  return result;
}